

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_splitting(test_state *state,int k)

{
  uint in_ESI;
  long in_RDI;
  uchar *tmp;
  int size;
  int status;
  ulong local_28;
  int in_stack_ffffffffffffffe0;
  int id;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  id = *(int *)(in_RDI + 0xc);
  if ((*(uint *)(*(long *)(in_RDI + 0x58) + 0x3c) & 8) == 0) {
    for (local_28 = *(ulong *)(in_RDI + 0x10);
        local_28 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
        local_28 = local_28 + (long)(id << 2)) {
      (**(code **)(in_RDI + 0x50))(local_28,0,id);
      (**(code **)(in_RDI + 0x50))(local_28 + (long)id,(1L << ((byte)in_ESI & 0x3f)) + -1,id);
      (**(code **)(in_RDI + 0x50))(local_28 + (long)(id << 1),0,id);
      (**(code **)(in_RDI + 0x50))
                (local_28 + (long)(id * 3),(1L << ((char)in_ESI + 2U & 0x3f)) + -1,id);
    }
  }
  else {
    for (local_28 = *(ulong *)(in_RDI + 0x10);
        local_28 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
        local_28 = local_28 + (long)(id << 2)) {
      (**(code **)(in_RDI + 0x50))
                (local_28,*(long *)(in_RDI + 0x48) + (1L << ((char)in_ESI - 1U & 0x3f)) + -1,id);
      (**(code **)(in_RDI + 0x50))(local_28 + (long)id,*(undefined8 *)(in_RDI + 0x48),id);
      (**(code **)(in_RDI + 0x50))
                (local_28 + (long)(id << 1),
                 *(long *)(in_RDI + 0x48) + (1L << ((char)in_ESI + 1U & 0x3f)) + -1,id);
      (**(code **)(in_RDI + 0x50))(local_28 + (long)(id * 3),*(undefined8 *)(in_RDI + 0x48),id);
    }
  }
  printf("Checking splitting with k=%i ... ",(ulong)in_ESI);
  local_4 = check_block_sizes((test_state *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),id,
                              in_stack_ffffffffffffffe0);
  if (local_4 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int check_splitting(struct test_state *state, int k)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, state->xmin + (1ULL << (k - 1)) - 1, size);
            state->out(tmp + size, state->xmin, size);
            state->out(tmp + 2 * size, state->xmin
                       + (1ULL << (k + 1)) - 1, size);
            state->out(tmp + 3 * size, state->xmin, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, (1ULL << k) - 1, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, (1ULL << (k + 2)) - 1, size);
        }
    }

    printf("Checking splitting with k=%i ... ", k);
    status = check_block_sizes(state, k + 1, state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}